

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DistConstraintListSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DistConstraintListSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *local_70;
  size_t index_local;
  DistConstraintListSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->dist).kind;
    token._2_1_ = (this->dist).field_0x2;
    token.numFlags.raw = (this->dist).numFlags.raw;
    token.rawLen = (this->dist).rawLen;
    token.info = (this->dist).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->openBrace).kind;
    token_00._2_1_ = (this->openBrace).field_0x2;
    token_00.numFlags.raw = (this->openBrace).numFlags.raw;
    token_00.rawLen = (this->openBrace).rawLen;
    token_00.info = (this->openBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    local_70 = (SyntaxNode *)0x0;
    if (this != (DistConstraintListSyntax *)0xffffffffffffffd0) {
      local_70 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 3:
    token_01.kind = (this->closeBrace).kind;
    token_01._2_1_ = (this->closeBrace).field_0x2;
    token_01.numFlags.raw = (this->closeBrace).numFlags.raw;
    token_01.rawLen = (this->closeBrace).rawLen;
    token_01.info = (this->closeBrace).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DistConstraintListSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return dist;
        case 1: return openBrace;
        case 2: return &items;
        case 3: return closeBrace;
        default: return nullptr;
    }
}